

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateReplayer::Impl::parse_render_passes2
          (Impl *this,StateCreatorInterface *iface,Value *passes)

{
  VkRenderPassCreateInfo2 *pVVar1;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  uint64_t uVar2;
  VkRenderPassCreateInfo2 *pVVar3;
  bool bVar4;
  SizeType SVar5;
  uint uVar6;
  int iVar7;
  ConstMemberIterator this_01;
  ConstMemberIterator CVar8;
  Ch *str;
  size_type sVar9;
  Type pGVar10;
  Hash hash;
  ulong local_60;
  uint64_t local_58;
  StateCreatorInterface *local_50;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_VkRenderPass_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkRenderPass_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_48;
  Value *local_40;
  VkRenderPassCreateInfo2 *local_38;
  
  local_50 = iface;
  SVar5 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::MemberCount(passes);
  local_38 = ScratchAllocator::allocate_n_cleared<VkRenderPassCreateInfo2>
                       (&this->allocator,(ulong)SVar5);
  this_01 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::MemberBegin(passes);
  local_48 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_VkRenderPass_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkRenderPass_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)&this->replayed_render_passes;
  local_60 = 0;
  local_40 = passes;
  while( true ) {
    CVar8 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::MemberEnd(passes);
    if (this_01.ptr_ == CVar8.ptr_) break;
    str = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetString(&(this_01.ptr_)->name);
    local_58 = string_to_uint64(str);
    sVar9 = std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkSampler_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkSampler_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::count(&(this->replayed_samplers)._M_h,&local_58);
    pVVar3 = local_38;
    if (sVar9 == 0) {
      this_00 = &(this_01.ptr_)->value;
      pVVar1 = local_38 + local_60;
      local_38[local_60].sType = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO_2;
      pGVar10 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                ::operator[]<char_const>
                          ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                            *)this_00,"flags");
      uVar6 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetUint(pGVar10);
      pVVar3[local_60].flags = uVar6;
      bVar4 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::HasMember(this_00,"correlatedViewMasks");
      if (bVar4) {
        pGVar10 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ::operator[]<char_const>
                            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                              *)this_00,"correlatedViewMasks");
        SVar5 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::Size(pGVar10);
        pVVar1->correlatedViewMaskCount = SVar5;
        pGVar10 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ::operator[]<char_const>
                            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                              *)this_00,"correlatedViewMasks");
        parse_uints(this,pGVar10,&pVVar1->pCorrelatedViewMasks);
      }
      bVar4 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::HasMember(this_00,"attachments");
      passes = local_40;
      if (bVar4) {
        pGVar10 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ::operator[]<char_const>
                            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                              *)this_00,"attachments");
        SVar5 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::Size(pGVar10);
        pVVar1->attachmentCount = SVar5;
        pGVar10 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ::operator[]<char_const>
                            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                              *)this_00,"attachments");
        bVar4 = parse_render_pass_attachments2(this,pGVar10,&pVVar1->pAttachments);
        if (!bVar4) goto LAB_00138274;
      }
      bVar4 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::HasMember(this_00,"dependencies");
      if (bVar4) {
        pGVar10 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ::operator[]<char_const>
                            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                              *)this_00,"dependencies");
        SVar5 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::Size(pGVar10);
        pVVar1->dependencyCount = SVar5;
        pGVar10 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ::operator[]<char_const>
                            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                              *)this_00,"dependencies");
        bVar4 = parse_render_pass_dependencies2(this,pGVar10,&pVVar1->pDependencies);
        if (!bVar4) goto LAB_00138274;
      }
      bVar4 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::HasMember(this_00,"subpasses");
      if (bVar4) {
        pGVar10 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ::operator[]<char_const>
                            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                              *)this_00,"subpasses");
        SVar5 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::Size(pGVar10);
        pVVar1->subpassCount = SVar5;
        pGVar10 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ::operator[]<char_const>
                            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                              *)this_00,"subpasses");
        bVar4 = parse_render_pass_subpasses2(this,pGVar10,&pVVar1->pSubpasses);
        if (!bVar4) goto LAB_00138274;
      }
      bVar4 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::HasMember(this_00,"pNext");
      if (bVar4) {
        pGVar10 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ::operator[]<char_const>
                            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                              *)this_00,"pNext");
        bVar4 = parse_pnext_chain(this,pGVar10,&pVVar1->pNext,(StateCreatorInterface *)0x0,
                                  (DatabaseInterface *)0x0,(Value *)0x0);
        if (!bVar4) goto LAB_00138274;
      }
      uVar2 = local_58;
      std::__detail::
      _Map_base<unsigned_long,_std::pair<const_unsigned_long,_VkRenderPass_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkRenderPass_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
      ::operator[](local_48,&local_58);
      iVar7 = (*local_50->_vptr_StateCreatorInterface[10])(local_50,uVar2,pVVar1);
      if ((char)iVar7 == '\0') goto LAB_00138274;
    }
    this_01.ptr_ = this_01.ptr_ + 1;
    local_60 = (ulong)((int)local_60 + 1);
  }
  (*local_50->_vptr_StateCreatorInterface[0x11])();
LAB_00138274:
  return this_01.ptr_ == CVar8.ptr_;
}

Assistant:

bool StateReplayer::Impl::parse_render_passes2(StateCreatorInterface &iface, const Value &passes)
{
	auto *infos = allocator.allocate_n_cleared<VkRenderPassCreateInfo2>(passes.MemberCount());

	unsigned index = 0;
	for (auto itr = passes.MemberBegin(); itr != passes.MemberEnd(); ++itr, index++)
	{
		Hash hash = string_to_uint64(itr->name.GetString());
		if (replayed_samplers.count(hash))
			continue;
		auto &obj = itr->value;
		auto &info = infos[index];
		info.sType = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO_2;

		info.flags = obj["flags"].GetUint();

		if (obj.HasMember("correlatedViewMasks"))
		{
			info.correlatedViewMaskCount = obj["correlatedViewMasks"].Size();
			if (!parse_uints(obj["correlatedViewMasks"], &info.pCorrelatedViewMasks))
				return false;
		}

		if (obj.HasMember("attachments"))
		{
			info.attachmentCount = obj["attachments"].Size();
			if (!parse_render_pass_attachments2(obj["attachments"], &info.pAttachments))
				return false;
		}

		if (obj.HasMember("dependencies"))
		{
			info.dependencyCount = obj["dependencies"].Size();
			if (!parse_render_pass_dependencies2(obj["dependencies"], &info.pDependencies))
				return false;
		}

		if (obj.HasMember("subpasses"))
		{
			info.subpassCount = obj["subpasses"].Size();
			if (!parse_render_pass_subpasses2(obj["subpasses"], &info.pSubpasses))
				return false;
		}

		if (obj.HasMember("pNext"))
			if (!parse_pnext_chain(obj["pNext"], &info.pNext))
				return false;

		if (!iface.enqueue_create_render_pass2(hash, &info, &replayed_render_passes[hash]))
			return false;
	}

	iface.notify_replayed_resources_for_type();
	return true;
}